

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O0

void msdfgen::generateMSDF
               (Bitmap<msdfgen::FloatRGB> *output,Shape *shape,double range,Vector2 *scale,
               Vector2 *translate,double edgeThreshold)

{
  SignedDistance b_00;
  SignedDistance a;
  SignedDistance b_01;
  SignedDistance a_00;
  SignedDistance b_02;
  SignedDistance a_01;
  SignedDistance b_03;
  SignedDistance a_02;
  SignedDistance b_04;
  SignedDistance a_03;
  SignedDistance b_05;
  SignedDistance a_04;
  const_iterator cVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  pointer pCVar7;
  reference pEVar8;
  reference pvVar9;
  EdgeSegment *pEVar10;
  reference pvVar11;
  FloatRGB *pFVar12;
  EdgeHolder *extraout_XMM0_Qa;
  double dVar13;
  double dVar14;
  Vector2 VVar15;
  int local_3a4;
  Vector2 local_388;
  Vector2 local_378;
  int local_364;
  int local_360;
  int i_3;
  int i_2;
  int i_1;
  MultiDistance msd;
  double medMinDistance;
  SignedDistance distance;
  double param;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_1d8;
  const_iterator edge;
  EdgePoint b;
  EdgePoint g;
  EdgePoint r;
  const_iterator cStack_168;
  int i;
  const_iterator contour_1;
  double dStack_158;
  int winding;
  double posDist;
  double negDist;
  double d;
  EdgePoint sb;
  EdgePoint sg;
  EdgePoint sr;
  Vector2 local_d0;
  double dStack_c0;
  Point2 p;
  int x;
  int row;
  int y;
  vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> contourSD;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_80;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_78;
  const_iterator contour;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> windings;
  int h;
  int w;
  int contourCount;
  double edgeThreshold_local;
  Vector2 *translate_local;
  Vector2 *scale_local;
  double range_local;
  Shape *shape_local;
  Bitmap<msdfgen::FloatRGB> *output_local;
  
  sVar6 = std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::size(&shape->contours);
  iVar4 = (int)sVar6;
  iVar5 = Bitmap<msdfgen::FloatRGB>::width(output);
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Bitmap<msdfgen::FloatRGB>::height(output);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_60,(long)iVar4);
  local_78._M_current =
       (Contour *)
       std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin(&shape->contours);
  while( true ) {
    local_80._M_current =
         (Contour *)
         std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end(&shape->contours);
    bVar3 = __gnu_cxx::operator!=(&local_78,&local_80);
    if (!bVar3) break;
    pCVar7 = __gnu_cxx::
             __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
             ::operator->(&local_78);
    contourSD.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Contour::winding(pCVar7);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_60,
               (value_type_conflict *)
               ((long)&contourSD.
                       super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    __gnu_cxx::
    __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
    ::operator++(&local_78);
  }
  std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::vector
            ((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> *)&row);
  std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::resize
            ((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> *)&row,
             (long)iVar4);
  for (x = 0; x < windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; x = x + 1) {
    if ((shape->inverseYAxis & 1U) == 0) {
      local_3a4 = x;
    }
    else {
      local_3a4 = (windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ - x) + -1;
    }
    for (p.y._4_4_ = 0; p.y._4_4_ < iVar5; p.y._4_4_ = p.y._4_4_ + 1) {
      Vector2::Vector2((Vector2 *)&sr.nearParam,(double)p.y._4_4_ + 0.5,(double)x + 0.5);
      VVar15 = Vector2::operator/((Vector2 *)&sr.nearParam,scale);
      local_d0 = VVar15;
      VVar15 = Vector2::operator-(&local_d0,translate);
      p.x = VVar15.y;
      dStack_c0 = VVar15.x;
      generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&sg.nearParam);
      generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&sb.nearParam);
      generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&d);
      sb.minDistance.dot = 0.0;
      sg.minDistance.dot = 0.0;
      sr.minDistance.dot = 0.0;
      sb.nearEdge = (EdgeHolder *)0x0;
      sg.nearEdge = (EdgeHolder *)0x0;
      sr.nearEdge = (EdgeHolder *)0x0;
      negDist = ABS(SignedDistance::INFINITE);
      posDist = -SignedDistance::INFINITE;
      dStack_158 = SignedDistance::INFINITE;
      contour_1._M_current._4_4_ = 0;
      cStack_168 = std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin
                             (&shape->contours);
      r.nearParam._4_4_ = 0;
      while (r.nearParam._4_4_ < iVar4) {
        generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&g.nearParam);
        generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&b.nearParam);
        generateMSDF::EdgePoint::EdgePoint((EdgePoint *)&edge);
        b.minDistance.dot = 0.0;
        g.minDistance.dot = 0.0;
        r.minDistance.dot = 0.0;
        b.nearEdge = (EdgeHolder *)0x0;
        g.nearEdge = (EdgeHolder *)0x0;
        r.nearEdge = (EdgeHolder *)0x0;
        pCVar7 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&stack0xfffffffffffffe98);
        local_1d8._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&pCVar7->edges);
        while( true ) {
          pCVar7 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&stack0xfffffffffffffe98);
          param = (double)std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                          end(&pCVar7->edges);
          bVar3 = __gnu_cxx::operator!=
                            (&local_1d8,
                             (__normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                              *)&param);
          if (!bVar3) break;
          pEVar8 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_1d8);
          pEVar10 = EdgeHolder::operator->(pEVar8);
          dVar13 = p.x;
          (*pEVar10->_vptr_EdgeSegment[5])(dStack_c0,pEVar10,&distance.dot);
          distance.distance = dVar13;
          pEVar8 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_1d8);
          pEVar10 = EdgeHolder::operator->(pEVar8);
          if ((pEVar10->color & RED) != BLACK) {
            a_04.dot = distance.distance;
            a_04.distance = (double)extraout_XMM0_Qa;
            b_05.dot = r.minDistance.distance;
            b_05.distance = g.nearParam;
            bVar3 = operator<(a_04,b_05);
            if (bVar3) {
              r.minDistance.distance = distance.distance;
              g.nearParam = (double)extraout_XMM0_Qa;
              r.minDistance.dot =
                   (double)__gnu_cxx::
                           __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                           ::operator*(&local_1d8);
              r.nearEdge = (EdgeHolder *)distance.dot;
            }
          }
          pEVar8 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_1d8);
          pEVar10 = EdgeHolder::operator->(pEVar8);
          if ((pEVar10->color & GREEN) != BLACK) {
            a_03.dot = distance.distance;
            a_03.distance = (double)extraout_XMM0_Qa;
            b_04.dot = g.minDistance.distance;
            b_04.distance = b.nearParam;
            bVar3 = operator<(a_03,b_04);
            if (bVar3) {
              g.minDistance.distance = distance.distance;
              b.nearParam = (double)extraout_XMM0_Qa;
              g.minDistance.dot =
                   (double)__gnu_cxx::
                           __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                           ::operator*(&local_1d8);
              g.nearEdge = (EdgeHolder *)distance.dot;
            }
          }
          pEVar8 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_1d8);
          pEVar10 = EdgeHolder::operator->(pEVar8);
          if ((pEVar10->color & BLUE) != BLACK) {
            a_02.dot = distance.distance;
            a_02.distance = (double)extraout_XMM0_Qa;
            b_03.dot = b.minDistance.distance;
            b_03.distance = (double)edge._M_current;
            bVar3 = operator<(a_02,b_03);
            if (bVar3) {
              b.minDistance.distance = distance.distance;
              edge._M_current = extraout_XMM0_Qa;
              b.minDistance.dot =
                   (double)__gnu_cxx::
                           __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                           ::operator*(&local_1d8);
              b.nearEdge = (EdgeHolder *)distance.dot;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_1d8);
        }
        a_01.dot = r.minDistance.distance;
        a_01.distance = g.nearParam;
        b_02.dot = sr.minDistance.distance;
        b_02.distance = sg.nearParam;
        bVar3 = operator<(a_01,b_02);
        if (bVar3) {
          sg.nearParam = g.nearParam;
          sr.minDistance.distance = r.minDistance.distance;
          sr.minDistance.dot = r.minDistance.dot;
          sr.nearEdge = r.nearEdge;
        }
        a_00.dot = g.minDistance.distance;
        a_00.distance = b.nearParam;
        b_01.dot = sg.minDistance.distance;
        b_01.distance = sb.nearParam;
        bVar3 = operator<(a_00,b_01);
        if (bVar3) {
          sb.nearParam = b.nearParam;
          sg.minDistance.distance = g.minDistance.distance;
          sg.minDistance.dot = g.minDistance.dot;
          sg.nearEdge = g.nearEdge;
        }
        a.dot = b.minDistance.distance;
        a.distance = (double)edge._M_current;
        b_00.dot = sb.minDistance.distance;
        b_00.distance = d;
        bVar3 = operator<(a,b_00);
        if (bVar3) {
          d = (double)edge._M_current;
          sb.minDistance.distance = b.minDistance.distance;
          sb.minDistance.dot = b.minDistance.dot;
          sb.nearEdge = b.nearEdge;
        }
        dVar13 = median<double>(g.nearParam,b.nearParam,(double)edge._M_current);
        if (ABS(dVar13) < negDist) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,(long)r.nearParam._4_4_)
          ;
          contour_1._M_current._4_4_ = -*pvVar9;
          negDist = ABS(dVar13);
        }
        if (r.minDistance.dot != 0.0) {
          pEVar10 = EdgeHolder::operator->((EdgeHolder *)r.minDistance.dot);
          (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)r.nearEdge,pEVar10,&g.nearParam);
        }
        if (g.minDistance.dot != 0.0) {
          pEVar10 = EdgeHolder::operator->((EdgeHolder *)g.minDistance.dot);
          (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)g.nearEdge,pEVar10,&b.nearParam);
        }
        if (b.minDistance.dot != 0.0) {
          pEVar10 = EdgeHolder::operator->((EdgeHolder *)b.minDistance.dot);
          (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)b.nearEdge,pEVar10,&edge);
        }
        dVar14 = median<double>(g.nearParam,b.nearParam,(double)edge._M_current);
        dVar2 = g.nearParam;
        pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                  operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                              *)&row,(long)r.nearParam._4_4_);
        dVar13 = b.nearParam;
        pvVar11->r = dVar2;
        pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                  operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                              *)&row,(long)r.nearParam._4_4_);
        cVar1 = edge;
        pvVar11->g = dVar13;
        pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                  operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                              *)&row,(long)r.nearParam._4_4_);
        pvVar11->b = (double)cVar1._M_current;
        pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                  operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                              *)&row,(long)r.nearParam._4_4_);
        pvVar11->med = dVar14;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,(long)r.nearParam._4_4_);
        if (((0 < *pvVar9) && (0.0 <= dVar14)) && (ABS(dVar14) < ABS(dStack_158))) {
          dStack_158 = dVar14;
        }
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,(long)r.nearParam._4_4_);
        if (((*pvVar9 < 0) && (dVar14 <= 0.0)) && (ABS(dVar14) < ABS(posDist))) {
          posDist = dVar14;
        }
        r.nearParam._4_4_ = r.nearParam._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
        ::operator++(&stack0xfffffffffffffe98);
      }
      if (sr.minDistance.dot != 0.0) {
        pEVar10 = EdgeHolder::operator->((EdgeHolder *)sr.minDistance.dot);
        (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)sr.nearEdge,pEVar10,&sg.nearParam);
      }
      if (sg.minDistance.dot != 0.0) {
        pEVar10 = EdgeHolder::operator->((EdgeHolder *)sg.minDistance.dot);
        (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)sg.nearEdge,pEVar10,&sb.nearParam);
      }
      if (sb.minDistance.dot != 0.0) {
        pEVar10 = EdgeHolder::operator->((EdgeHolder *)sb.minDistance.dot);
        msd.med = dStack_c0;
        (*pEVar10->_vptr_EdgeSegment[6])(dStack_c0,p.x,(int)sb.nearEdge,pEVar10,&d);
      }
      msd.b = SignedDistance::INFINITE;
      msd.g = SignedDistance::INFINITE;
      msd.r = SignedDistance::INFINITE;
      _i_2 = SignedDistance::INFINITE;
      if ((dStack_158 < 0.0) || (ABS(posDist) < ABS(dStack_158))) {
        if ((posDist <= 0.0) && (ABS(posDist) <= ABS(dStack_158))) {
          msd.b = -SignedDistance::INFINITE;
          contour_1._M_current._4_4_ = -1;
          for (local_360 = 0; local_360 < iVar4; local_360 = local_360 + 1) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_60,(long)local_360);
            if (*pvVar9 < 0) {
              pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                        ::operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                      *)&row,(long)local_360);
              if (pvVar11->med < msd.b) {
                pvVar11 = std::
                          vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                          operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                      *)&row,(long)local_360);
                if (ABS(pvVar11->med) < ABS(dStack_158)) {
                  pvVar11 = std::
                            vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                            ::operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                          *)&row,(long)local_360);
                  _i_2 = pvVar11->r;
                  msd.r = pvVar11->g;
                  msd.g = pvVar11->b;
                  msd.b = pvVar11->med;
                }
              }
            }
          }
        }
      }
      else {
        contour_1._M_current._4_4_ = 1;
        for (i_3 = 0; i_3 < iVar4; i_3 = i_3 + 1) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,(long)i_3);
          if (0 < *pvVar9) {
            pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                      operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                  *)&row,(long)i_3);
            if (msd.b < pvVar11->med) {
              pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                        ::operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                      *)&row,(long)i_3);
              if (ABS(pvVar11->med) < ABS(posDist)) {
                pvVar11 = std::
                          vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                          operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                      *)&row,(long)i_3);
                _i_2 = pvVar11->r;
                msd.r = pvVar11->g;
                msd.g = pvVar11->b;
                msd.b = pvVar11->med;
              }
            }
          }
        }
      }
      for (local_364 = 0; local_364 < iVar4; local_364 = local_364 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,(long)local_364);
        if (*pvVar9 != contour_1._M_current._4_4_) {
          pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                    operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                *)&row,(long)local_364);
          if (ABS(pvVar11->med) < ABS(msd.b)) {
            pvVar11 = std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::
                      operator[]((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                                  *)&row,(long)local_364);
            _i_2 = pvVar11->r;
            msd.r = pvVar11->g;
            msd.g = pvVar11->b;
            msd.b = pvVar11->med;
          }
        }
      }
      dVar13 = median<double>(sg.nearParam,sb.nearParam,d);
      if ((dVar13 == msd.b) && (!NAN(dVar13) && !NAN(msd.b))) {
        _i_2 = sg.nearParam;
        msd.r = sb.nearParam;
        msd.g = d;
      }
      dVar13 = _i_2 / range;
      pFVar12 = Bitmap<msdfgen::FloatRGB>::operator()(output,p.y._4_4_,local_3a4);
      pFVar12->r = (float)(dVar13 + 0.5);
      dVar13 = msd.r / range;
      pFVar12 = Bitmap<msdfgen::FloatRGB>::operator()(output,p.y._4_4_,local_3a4);
      pFVar12->g = (float)(dVar13 + 0.5);
      dVar13 = msd.g / range;
      pFVar12 = Bitmap<msdfgen::FloatRGB>::operator()(output,p.y._4_4_,local_3a4);
      pFVar12->b = (float)(dVar13 + 0.5);
    }
  }
  std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::~vector
            ((vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> *)&row);
  if (0.0 < edgeThreshold) {
    local_388 = Vector2::operator*(scale,range);
    local_378 = operator/(edgeThreshold,&local_388);
    msdfErrorCorrection(output,&local_378);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return;
}

Assistant:

void generateMSDF(Bitmap<FloatRGB> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate, double edgeThreshold) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<MultiDistance> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;

                struct EdgePoint {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge;
                    double nearParam;
                } sr, sg, sb;
                sr.nearEdge = sg.nearEdge = sb.nearEdge = NULL;
                sr.nearParam = sg.nearParam = sb.nearParam = 0;
                double d = fabs(SignedDistance::INFINITE.distance);
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    EdgePoint r, g, b;
                    r.nearEdge = g.nearEdge = b.nearEdge = NULL;
                    r.nearParam = g.nearParam = b.nearParam = 0;

                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if ((*edge)->color&RED && distance < r.minDistance) {
                            r.minDistance = distance;
                            r.nearEdge = &*edge;
                            r.nearParam = param;
                        }
                        if ((*edge)->color&GREEN && distance < g.minDistance) {
                            g.minDistance = distance;
                            g.nearEdge = &*edge;
                            g.nearParam = param;
                        }
                        if ((*edge)->color&BLUE && distance < b.minDistance) {
                            b.minDistance = distance;
                            b.nearEdge = &*edge;
                            b.nearParam = param;
                        }
                    }
                    if (r.minDistance < sr.minDistance)
                        sr = r;
                    if (g.minDistance < sg.minDistance)
                        sg = g;
                    if (b.minDistance < sb.minDistance)
                        sb = b;

                    double medMinDistance = fabs(median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance));
                    if (medMinDistance < d) {
                        d = medMinDistance;
                        winding = -windings[i];
                    }
                    if (r.nearEdge)
                        (*r.nearEdge)->distanceToPseudoDistance(r.minDistance, p, r.nearParam);
                    if (g.nearEdge)
                        (*g.nearEdge)->distanceToPseudoDistance(g.minDistance, p, g.nearParam);
                    if (b.nearEdge)
                        (*b.nearEdge)->distanceToPseudoDistance(b.minDistance, p, b.nearParam);
                    medMinDistance = median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance);
                    contourSD[i].r = r.minDistance.distance;
                    contourSD[i].g = g.minDistance.distance;
                    contourSD[i].b = b.minDistance.distance;
                    contourSD[i].med = medMinDistance;
                    if (windings[i] > 0 && medMinDistance >= 0 && fabs(medMinDistance) < fabs(posDist))
                        posDist = medMinDistance;
                    if (windings[i] < 0 && medMinDistance <= 0 && fabs(medMinDistance) < fabs(negDist))
                        negDist = medMinDistance;
                }
                if (sr.nearEdge)
                    (*sr.nearEdge)->distanceToPseudoDistance(sr.minDistance, p, sr.nearParam);
                if (sg.nearEdge)
                    (*sg.nearEdge)->distanceToPseudoDistance(sg.minDistance, p, sg.nearParam);
                if (sb.nearEdge)
                    (*sb.nearEdge)->distanceToPseudoDistance(sb.minDistance, p, sb.nearParam);

                MultiDistance msd;
                msd.r = msd.g = msd.b = msd.med = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    msd.med = SignedDistance::INFINITE.distance;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i].med > msd.med && fabs(contourSD[i].med) < fabs(negDist))
                            msd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    msd.med = -SignedDistance::INFINITE.distance;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i].med < msd.med && fabs(contourSD[i].med) < fabs(posDist))
                            msd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i].med) < fabs(msd.med))
                        msd = contourSD[i];
                if (median(sr.minDistance.distance, sg.minDistance.distance, sb.minDistance.distance) == msd.med) {
                    msd.r = sr.minDistance.distance;
                    msd.g = sg.minDistance.distance;
                    msd.b = sb.minDistance.distance;
                }

                output(x, row).r = float(msd.r/range+.5);
                output(x, row).g = float(msd.g/range+.5);
                output(x, row).b = float(msd.b/range+.5);
            }
        }
    }

    if (edgeThreshold > 0)
        msdfErrorCorrection(output, edgeThreshold/(scale*range));
}